

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

int install_bpf_program(pcap_t *p,bpf_program *fp)

{
  int iVar1;
  size_t __size;
  bpf_insn *pbVar2;
  int *piVar3;
  char *pcVar4;
  size_t prog_size;
  bpf_program *fp_local;
  pcap_t *p_local;
  
  iVar1 = bpf_validate(fp->bf_insns,fp->bf_len);
  if (iVar1 == 0) {
    snprintf(p->errbuf,0x101,"BPF program is not valid");
    p_local._4_4_ = -1;
  }
  else {
    pcap_freecode(&p->fcode);
    __size = (ulong)fp->bf_len << 3;
    (p->fcode).bf_len = fp->bf_len;
    pbVar2 = (bpf_insn *)malloc(__size);
    (p->fcode).bf_insns = pbVar2;
    if ((p->fcode).bf_insns == (bpf_insn *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = pcap_strerror(*piVar3);
      snprintf(p->errbuf,0x101,"malloc: %s",pcVar4);
      p_local._4_4_ = -1;
    }
    else {
      memcpy((p->fcode).bf_insns,fp->bf_insns,__size);
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int
install_bpf_program(pcap_t *p, struct bpf_program *fp)
{
	size_t prog_size;

	/*
	 * Validate the program.
	 */
	if (!bpf_validate(fp->bf_insns, fp->bf_len)) {
		pcap_snprintf(p->errbuf, sizeof(p->errbuf),
			"BPF program is not valid");
		return (-1);
	}

	/*
	 * Free up any already installed program.
	 */
	pcap_freecode(&p->fcode);

	prog_size = sizeof(*fp->bf_insns) * fp->bf_len;
	p->fcode.bf_len = fp->bf_len;
	p->fcode.bf_insns = (struct bpf_insn *)malloc(prog_size);
	if (p->fcode.bf_insns == NULL) {
		pcap_snprintf(p->errbuf, sizeof(p->errbuf),
			 "malloc: %s", pcap_strerror(errno));
		return (-1);
	}
	memcpy(p->fcode.bf_insns, fp->bf_insns, prog_size);
	return (0);
}